

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsCell.cpp
# Opt level: O3

void __thiscall KDReports::Cell::Cell(Cell *this)

{
  CellPrivate *pCVar1;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__Cell_001736f0;
  pCVar1 = (CellPrivate *)operator_new(0x48);
  (pCVar1->m_elements).d.d = 0;
  *(ElementData **)((long)&(pCVar1->m_elements).d + 8) = (ElementData *)0x0;
  *(qsizetype *)((long)&(pCVar1->m_elements).d + 0x10) = 0;
  pCVar1->m_columnSpan = 1;
  pCVar1->m_rowSpan = 1;
  pCVar1->m_verticalAlignment = 0;
  *(undefined8 *)&(pCVar1->m_cellFormatFunc).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pCVar1->m_cellFormatFunc).super__Function_base + 8) = 0;
  *(_Manager_type *)((long)&(pCVar1->m_cellFormatFunc).super__Function_base + 0x10) =
       (_Manager_type)0x0;
  (pCVar1->m_cellFormatFunc)._M_invoker = (_Invoker_type)0x0;
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::CellPrivate,_std::default_delete<KDReports::CellPrivate>_>._M_t.
  super__Tuple_impl<0UL,_KDReports::CellPrivate_*,_std::default_delete<KDReports::CellPrivate>_>.
  super__Head_base<0UL,_KDReports::CellPrivate_*,_false>._M_head_impl = pCVar1;
  return;
}

Assistant:

KDReports::Cell::Cell()
    : d(new CellPrivate)
{
}